

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_dform39(DisasContext_conflict10 *ctx)

{
  _Bool _Var1;
  TCGv_i64 pTVar2;
  TCGv_i64 pTVar3;
  uint uVar4;
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o;
  TCGTemp *ts;
  uint32_t uStack_30;
  
  switch(ctx->opcode & 3) {
  case 0:
    if ((ctx->insns_flags2 & 0x20) == 0) goto switchD_009f3dc7_caseD_1;
    if (ctx->fpu_enabled == false) {
      uStack_30 = 7;
      goto LAB_009f3f9a;
    }
    tcg_ctx = ctx->uc->tcg_ctx;
    gen_set_access_type(ctx,0x30);
    pTVar2 = tcg_temp_new_i64(tcg_ctx);
    gen_addr_imm_index(ctx,pTVar2,0);
    pTVar3 = tcg_temp_new_i64(tcg_ctx);
    _Var1 = ctx->le_mode;
    gen_qemu_ld64_i64(ctx,pTVar3,pTVar2);
    uVar4 = ctx->opcode >> 0x15 & 0x1f;
    if (_Var1 == true) {
      set_fpr(tcg_ctx,uVar4 + 1,pTVar3);
      tcg_gen_addi_i64_ppc64(tcg_ctx,pTVar2,pTVar2,8);
      gen_qemu_ld64_i64(ctx,pTVar3,pTVar2);
      uVar4 = ctx->opcode >> 0x15 & 0x1f;
    }
    else {
      set_fpr(tcg_ctx,uVar4,pTVar3);
      tcg_gen_addi_i64_ppc64(tcg_ctx,pTVar2,pTVar2,8);
      gen_qemu_ld64_i64(ctx,pTVar3,pTVar2);
      uVar4 = (ctx->opcode >> 0x15 & 0x1f) + 1;
    }
    set_fpr(tcg_ctx,uVar4,pTVar3);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    ts = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    goto LAB_009f3f87;
  case 1:
switchD_009f3dc7_caseD_1:
    gen_invalid(ctx);
    return;
  case 2:
    if ((ctx->insns_flags2 & 0x80000) == 0) goto switchD_009f3dc7_caseD_1;
    if (ctx->altivec_enabled == false) {
LAB_009f3f94:
      uStack_30 = 0x49;
LAB_009f3f9a:
      gen_exception(ctx,uStack_30);
      return;
    }
    tcg_ctx = ctx->uc->tcg_ctx;
    pTVar2 = tcg_temp_new_i64(tcg_ctx);
    gen_set_access_type(ctx,0x20);
    pTVar3 = tcg_temp_new_i64(tcg_ctx);
    gen_addr_imm_index(ctx,pTVar3,3);
    gen_qemu_ld64_i64(ctx,pTVar2,pTVar3);
    break;
  case 3:
    if ((ctx->insns_flags2 & 0x80000) == 0) goto switchD_009f3dc7_caseD_1;
    if (ctx->altivec_enabled == false) goto LAB_009f3f94;
    tcg_ctx = ctx->uc->tcg_ctx;
    pTVar2 = tcg_temp_new_i64(tcg_ctx);
    gen_set_access_type(ctx,0x20);
    pTVar3 = tcg_temp_new_i64(tcg_ctx);
    gen_addr_imm_index(ctx,pTVar3,3);
    gen_qemu_ld32fs(ctx,pTVar2,pTVar3);
  }
  set_cpu_vsrh(tcg_ctx,ctx->opcode >> 0x15 & 0x1f | 0x20,pTVar2);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
  ts = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
LAB_009f3f87:
  tcg_temp_free_internal_ppc64(tcg_ctx,ts);
  return;
}

Assistant:

static void gen_dform39(DisasContext *ctx)
{
    switch (ctx->opcode & 0x3) {
    case 0: /* lfdp */
        if (ctx->insns_flags2 & PPC2_ISA205) {
            return gen_lfdp(ctx);
        }
        break;
    case 2: /* lxsd */
        if (ctx->insns_flags2 & PPC2_ISA300) {
            return gen_lxsd(ctx);
        }
        break;
    case 3: /* lxssp */
        if (ctx->insns_flags2 & PPC2_ISA300) {
            return gen_lxssp(ctx);
        }
        break;
    }
    return gen_invalid(ctx);
}